

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

double __thiscall
helics::DelayFilterOperation::getProperty(DelayFilterOperation *this,string_view property)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  char *in_RDX;
  char *in_RSI;
  FilterOperations *in_RDI;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  char *pcVar3;
  double local_8;
  
  pcVar3 = in_RSI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __x._M_str = pcVar3;
  __x._M_len = in_stack_ffffffffffffffc8;
  __y._M_str = in_stack_ffffffffffffffc0;
  __y._M_len = in_stack_ffffffffffffffb8;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    std::atomic<TimeRepresentation<count_time<9,_long>_>_>::load
              ((atomic<TimeRepresentation<count_time<9,_long>_>_> *)(in_RDI + 1),seq_cst);
    local_8 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x3c0333);
  }
  else {
    sVar1._M_str = in_RDX;
    sVar1._M_len = (size_t)in_RSI;
    local_8 = FilterOperations::getProperty(in_RDI,sVar1);
  }
  return local_8;
}

Assistant:

double DelayFilterOperation::getProperty(std::string_view property)
{
    if (property == "delay") {
        return static_cast<double>(delay.load());
    }
    return FilterOperations::getProperty(property);
}